

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

ON_Mesh * ON_MeshParent(ON_Geometry *geo)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_MeshComponentRef *this;
  ON_MeshComponentRef *cref;
  ON_Mesh *local_20;
  ON_Mesh *mesh;
  ON_Geometry *geo_local;
  
  local_20 = (ON_Mesh *)0x0;
  if (geo == (ON_Geometry *)0x0) {
    geo_local = (ON_Geometry *)0x0;
  }
  else {
    mesh = (ON_Mesh *)geo;
    iVar2 = (*(geo->super_ON_Object)._vptr_ON_Object[0xc])();
    if (iVar2 == 0x20) {
      local_20 = ON_Mesh::Cast((ON_Object *)mesh);
    }
    else {
      iVar2 = (*(mesh->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x22])();
      cref = (ON_MeshComponentRef *)CONCAT44(extraout_var,iVar2);
      bVar1 = ON_COMPONENT_INDEX::IsMeshComponentIndex((ON_COMPONENT_INDEX *)&cref);
      if ((bVar1) &&
         (this = ON_MeshComponentRef::Cast((ON_Object *)mesh), this != (ON_MeshComponentRef *)0x0))
      {
        local_20 = ON_MeshComponentRef::Mesh(this);
      }
    }
    geo_local = &local_20->super_ON_Geometry;
  }
  return (ON_Mesh *)geo_local;
}

Assistant:

const ON_Mesh* ON_MeshParent( const ON_Geometry* geo )
{
  const ON_Mesh* mesh = 0;

  if ( geo == nullptr )
    return nullptr;

  if  ( ON::mesh_object == geo->ObjectType() )
  {
    mesh = ON_Mesh::Cast(geo);
  }
  else if ( geo->ComponentIndex().IsMeshComponentIndex() )
  {
    const ON_MeshComponentRef* cref = ON_MeshComponentRef::Cast(geo);
    if ( cref )
      mesh = cref->Mesh();
  }

  return mesh;
}